

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_movem_16_er_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  uVar3 = m68ki_cpu.pc;
  m68ki_address_space = 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar2 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar3 = (int)(short)uVar2 + uVar3;
  lVar4 = 0;
  iVar6 = 0;
  do {
    if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      my_fc_handler(m68ki_cpu.s_flag | 2);
      uVar5 = uVar3;
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar5 = pmmu_translate_addr(uVar3);
      }
      uVar2 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
      m68ki_cpu.dar[lVar4] = (int)(short)uVar2;
      uVar3 = uVar3 + 2;
      iVar6 = iVar6 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar6 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_er_pcdi(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_PCDI_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			REG_DA[i] = MAKE_INT_16(MASK_OUT_ABOVE_16(m68ki_read_pcrel_16(ea)));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}